

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto_test.h
# Opt level: O1

void upb_test::RoundTripDescriptor(FileDescriptorSet *set)

{
  _Alloc_hider buf;
  size_type size_00;
  undefined1 auVar1 [8];
  InternalMetadata size_01;
  _Bool _Var2;
  bool bVar3;
  upb_DecodeStatus uVar4;
  upb_DefPool *s;
  Rep *pRVar5;
  FileDescriptor *this;
  upb_Arena *puVar6;
  upb_FileDef *f;
  char *pcVar7;
  size_t sVar8;
  size_t *in_R9;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *pRVar9;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *this_00;
  google_protobuf_FileDescriptorProto *pgVar10;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  msg;
  AssertionResult gtest_ar_1;
  string serialized;
  NullErrorCollector collector;
  google_protobuf_FileDescriptorProto *proto;
  size_t size;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  FileDescriptorProto google_proto;
  FileDescriptorProto normalized_file;
  DescriptorPool desc_pool;
  FileDescriptorProto mutable_file;
  Status status;
  char local_9c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_9b8;
  string local_9b0;
  ErrorCollector local_990;
  google_protobuf_FileDescriptorProto *local_988;
  void **local_980;
  int local_978 [2];
  undefined1 local_970 [8];
  InternalMetadata local_968;
  anon_union_232_1_493b367e_for_FileDescriptorProto_3 local_960;
  undefined1 local_878 [8];
  InternalMetadata local_870;
  undefined1 local_780 [8];
  InternalMetadata local_778;
  undefined1 local_688 [8];
  InternalMetadata local_680;
  FileDescriptorProto local_590;
  DescriptorPool local_498;
  FileDescriptorProto local_420;
  FileDescriptorProto local_328;
  upb_Status local_230;
  
  s = upb_DefPool_New();
  google::protobuf::DescriptorPool::DescriptorPool(&local_498);
  local_498.enforce_weak_ = true;
  this_00 = &(set->field_0)._impl_.file_;
  pRVar9 = this_00;
  if ((*(byte *)((long)&set->field_0 + 0x18) & 1) != 0) {
    pRVar5 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&this_00->super_RepeatedPtrFieldBase);
    pRVar9 = (RepeatedPtrField<google::protobuf::FileDescriptorProto> *)pRVar5->elements;
  }
  if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar5 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&this_00->super_RepeatedPtrFieldBase);
    this_00 = (RepeatedPtrField<google::protobuf::FileDescriptorProto> *)pRVar5->elements;
  }
  local_980 = &(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
              *(int *)((long)&set->field_0 + 0x20);
  if (pRVar9 != (RepeatedPtrField<google::protobuf::FileDescriptorProto> *)local_980) {
    do {
      google::protobuf::FileDescriptorProto::FileDescriptorProto
                (&local_328,(Arena *)0x0,
                 (FileDescriptorProto *)(pRVar9->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
      local_990._vptr_ErrorCollector = (_func_int **)&PTR__ErrorCollector_00582da8;
      this = google::protobuf::DescriptorPool::BuildFileCollectingErrors
                       (&local_498,&local_328,&local_990);
      if (this == (FileDescriptor *)0x0) {
        local_970 = (undefined1  [8])&local_960;
        local_968.ptr_ = 0;
        local_960._impl_._has_bits_.has_bits_[0]._0_1_ = 0;
        google::protobuf::MessageLite::SerializeToString
                  ((MessageLite *)&local_328,(string *)local_970);
        puVar6 = upb_Arena_Init((void *)0x0,0,&upb_alloc_global);
        upb_Status_Clear(&local_230);
        size_01.ptr_ = local_968.ptr_;
        auVar1 = local_970;
        msg._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             puVar6->ptr_dont_copy_me__upb_internal_use_only;
        if ((ulong)((long)puVar6->end_dont_copy_me__upb_internal_use_only - (long)msg._M_head_impl)
            < 0x90) {
          msg._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar6,0x90);
        }
        else {
          if ((anon_union_8_2_9eb4e620_for_upb_Message_0 *)
              ((ulong)((long)msg._M_head_impl + 7U) & 0xfffffffffffffff8) !=
              (anon_union_8_2_9eb4e620_for_upb_Message_0 *)msg._M_head_impl) goto LAB_001adce5;
          puVar6->ptr_dont_copy_me__upb_internal_use_only = (char *)((long)msg._M_head_impl + 0x90);
        }
        if ((anon_union_8_2_9eb4e620_for_upb_Message_0 *)msg._M_head_impl ==
            (anon_union_8_2_9eb4e620_for_upb_Message_0 *)0x0) {
          msg._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        else {
          memset(msg._M_head_impl,0,0x90);
        }
        if ((anon_union_8_2_9eb4e620_for_upb_Message_0 *)msg._M_head_impl ==
            (anon_union_8_2_9eb4e620_for_upb_Message_0 *)0x0) {
          msg._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        else {
          in_R9 = (size_t *)0x0;
          uVar4 = upb_Decode((char *)auVar1,size_01.ptr_,(upb_Message *)msg._M_head_impl,
                             &google__protobuf__FileDescriptorProto_msg_init,
                             (upb_ExtensionRegistry *)0x0,0,puVar6);
          if (uVar4 != kUpb_DecodeStatus_Ok) {
            msg._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        local_878 = (undefined1  [8])0x0;
        local_780 = (undefined1  [8])msg._M_head_impl;
        testing::internal::CmpHelperNE<google_protobuf_FileDescriptorProto*,decltype(nullptr)>
                  ((internal *)local_688,"proto","nullptr",
                   (google_protobuf_FileDescriptorProto **)local_780,(void **)local_878);
        if (local_688[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_878);
          pcVar7 = "";
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_680.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar7 = *(char **)local_680.ptr_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_590,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/util/def_to_proto_test.h"
                     ,0x6c,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_590,(Message *)local_878);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_590);
          if (local_878 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_878 + 8))();
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_680.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_680,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_680.ptr_);
          }
          upb_Arena_Free(puVar6);
        }
        else {
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_680.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_680,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_680.ptr_);
          }
          upb_DefPool_AddFile(s,(google_protobuf_FileDescriptorProto *)local_780,&local_230);
          upb_Arena_Free(puVar6);
        }
        if (local_970 != (undefined1  [8])&local_960) {
          operator_delete((void *)local_970,
                          CONCAT71(local_960._1_7_,local_960._impl_._has_bits_.has_bits_[0]._0_1_) +
                          1);
        }
      }
      else {
        google::protobuf::FileDescriptorProto::FileDescriptorProto
                  ((FileDescriptorProto *)local_688,(Arena *)0x0);
        google::protobuf::FileDescriptor::CopyTo(this,(FileDescriptorProto *)local_688);
        local_9b0._M_dataplus._M_p = (pointer)&local_9b0.field_2;
        local_9b0._M_string_length = 0;
        local_9b0.field_2._M_local_buf[0] = '\0';
        google::protobuf::MessageLite::SerializeToString((MessageLite *)local_688,&local_9b0);
        puVar6 = upb_Arena_Init((void *)0x0,0,&upb_alloc_global);
        upb_Status_Clear(&local_230);
        size_00 = local_9b0._M_string_length;
        buf._M_p = local_9b0._M_dataplus._M_p;
        pgVar10 = (google_protobuf_FileDescriptorProto *)
                  puVar6->ptr_dont_copy_me__upb_internal_use_only;
        if ((ulong)((long)puVar6->end_dont_copy_me__upb_internal_use_only - (long)pgVar10) < 0x90) {
          pgVar10 = (google_protobuf_FileDescriptorProto *)
                    _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar6,0x90);
        }
        else {
          if ((google_protobuf_FileDescriptorProto *)
              ((ulong)((long)&(pgVar10->base_dont_copy_me__upb_internal_use_only).field_0 + 7U) &
              0xfffffffffffffff8) != pgVar10) {
LAB_001adce5:
            __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                          ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
          }
          puVar6->ptr_dont_copy_me__upb_internal_use_only = (char *)(pgVar10 + 0x12);
        }
        if (pgVar10 == (google_protobuf_FileDescriptorProto *)0x0) {
          pgVar10 = (google_protobuf_FileDescriptorProto *)0x0;
        }
        else {
          memset(pgVar10,0,0x90);
        }
        if (pgVar10 == (google_protobuf_FileDescriptorProto *)0x0) {
          pgVar10 = (google_protobuf_FileDescriptorProto *)0x0;
        }
        else {
          in_R9 = (size_t *)0x0;
          uVar4 = upb_Decode(buf._M_p,size_00,&pgVar10->base_dont_copy_me__upb_internal_use_only,
                             &google__protobuf__FileDescriptorProto_msg_init,
                             (upb_ExtensionRegistry *)0x0,0,puVar6);
          if (uVar4 != kUpb_DecodeStatus_Ok) {
            pgVar10 = (google_protobuf_FileDescriptorProto *)0x0;
          }
        }
        local_780 = (undefined1  [8])0x0;
        local_988 = pgVar10;
        testing::internal::CmpHelperNE<google_protobuf_FileDescriptorProto*,decltype(nullptr)>
                  ((internal *)local_970,"proto","nullptr",&local_988,(void **)local_780);
        if (local_970[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_780);
          pcVar7 = "";
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_968.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar7 = *(char **)local_968.ptr_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_878,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/util/def_to_proto_test.h"
                     ,0x49,pcVar7);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_878,(Message *)local_780)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_878);
          if (local_780 != (undefined1  [8])0x0) {
            (**(code **)(*(anon_union_8_2_9eb4e620_for_upb_Message_0 *)local_780 + 8))();
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_968.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_968,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_968.ptr_);
          }
          upb_Arena_Free(puVar6);
        }
        else {
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_968.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_968,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_968.ptr_);
          }
          f = upb_DefPool_AddFile(s,local_988,&local_230);
          if (f != (upb_FileDef *)0x0) {
            _Var2 = upb_Status_IsOk(&local_230);
            local_780[0] = _Var2;
            local_778.ptr_ = 0;
            if (!_Var2) {
              testing::Message::Message((Message *)local_878);
              pcVar7 = upb_Status_ErrorMessage(&local_230);
              auVar1 = local_878;
              if (pcVar7 == (char *)0x0) {
                sVar8 = 6;
                pcVar7 = "(null)";
              }
              else {
                sVar8 = strlen(pcVar7);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)((long)auVar1 + 0x10),pcVar7,sVar8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_970,(internal *)local_780,(AssertionResult *)"status.ok()",
                         "false","true",(char *)in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_590,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/util/def_to_proto_test.h"
                         ,0x58,(char *)local_970);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_590,(Message *)local_878);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_590);
              if (local_970 != (undefined1  [8])&local_960) {
                operator_delete((void *)local_970,
                                CONCAT71(local_960._1_7_,
                                         local_960._impl_._has_bits_.has_bits_[0]._0_1_) + 1);
              }
              if (local_878 != (undefined1  [8])0x0) {
                (**(code **)(*(long *)local_878 + 8))();
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_778.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_778,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_778.ptr_);
              }
              if (!_Var2) goto LAB_001adc2b;
            }
            pgVar10 = upb_FileDef_ToProto(f,puVar6);
            in_R9 = (size_t *)local_978;
            upb_Encode(&pgVar10->base_dont_copy_me__upb_internal_use_only,
                       &google__protobuf__FileDescriptorProto_msg_init,0,puVar6,(char **)local_970,
                       in_R9);
            auVar1 = local_970;
            google::protobuf::FileDescriptorProto::FileDescriptorProto
                      ((FileDescriptorProto *)local_780,(Arena *)0x0);
            bVar3 = google::protobuf::MessageLite::ParseFromArray
                              ((MessageLite *)local_780,(void *)auVar1,local_978[0]);
            local_878[0] = bVar3;
            local_870.ptr_ = 0;
            if (bVar3) {
LAB_001adaee:
              google::protobuf::FileDescriptorProto::FileDescriptorProto
                        (&local_420,(Arena *)0x0,(FileDescriptorProto *)local_688);
              google::protobuf::FileDescriptorProto::FileDescriptorProto
                        ((FileDescriptorProto *)local_970,(Arena *)0x0,&local_420);
              google::protobuf::FileDescriptorProto::FileDescriptorProto
                        (&local_590,(Arena *)0x0,(FileDescriptorProto *)local_970);
              google::protobuf::FileDescriptorProto::~FileDescriptorProto
                        ((FileDescriptorProto *)local_970);
              google::protobuf::FileDescriptorProto::FileDescriptorProto
                        ((FileDescriptorProto *)local_970,(Arena *)0x0,&local_590);
              google::protobuf::FileDescriptorProto::FileDescriptorProto
                        ((FileDescriptorProto *)local_878,(Arena *)0x0,
                         (FileDescriptorProto *)local_970);
              google::protobuf::FileDescriptorProto::~FileDescriptorProto
                        ((FileDescriptorProto *)local_970);
              testing::internal::
              PredicateFormatterFromMatcher<upb_test::EqualsProtoTreatNansAsEqualMatcherP<google::protobuf::FileDescriptorProto>>
              ::operator()(local_9c0,(char *)local_878,(FileDescriptorProto *)"google_proto");
              google::protobuf::FileDescriptorProto::~FileDescriptorProto
                        ((FileDescriptorProto *)local_878);
              google::protobuf::FileDescriptorProto::~FileDescriptorProto(&local_590);
              google::protobuf::FileDescriptorProto::~FileDescriptorProto(&local_420);
              if (local_9c0[0] == '\0') {
                testing::Message::Message((Message *)local_970);
                pcVar7 = "";
                if (local_9b8 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar7 = (local_9b8->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_878,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/util/def_to_proto_test.h"
                           ,0x61,pcVar7);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_878,(Message *)local_970);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_878);
                if (local_970 != (undefined1  [8])0x0) {
                  (**(code **)(*(long *)local_970 + 8))();
                }
              }
              if (local_9b8 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_9b8,local_9b8);
              }
            }
            else {
              testing::Message::Message((Message *)&local_590);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_970,(internal *)local_878,(AssertionResult *)"ok","false",
                         "true",(char *)in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_420,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/util/def_to_proto_test.h"
                         ,0x60,(char *)local_970);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_420,(Message *)&local_590);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_420);
              if (local_970 != (undefined1  [8])&local_960) {
                operator_delete((void *)local_970,
                                CONCAT71(local_960._1_7_,
                                         local_960._impl_._has_bits_.has_bits_[0]._0_1_) + 1);
              }
              if (local_590.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0)
              {
                (**(code **)(*local_590.super_Message.super_MessageLite._vptr_MessageLite + 8))();
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_870.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_870,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_870.ptr_);
              }
              if (bVar3) goto LAB_001adaee;
            }
            google::protobuf::FileDescriptorProto::~FileDescriptorProto
                      ((FileDescriptorProto *)local_780);
          }
LAB_001adc2b:
          upb_Arena_Free(puVar6);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9b0._M_dataplus._M_p != &local_9b0.field_2) {
          operator_delete(local_9b0._M_dataplus._M_p,
                          CONCAT71(local_9b0.field_2._M_allocated_capacity._1_7_,
                                   local_9b0.field_2._M_local_buf[0]) + 1);
        }
        google::protobuf::FileDescriptorProto::~FileDescriptorProto
                  ((FileDescriptorProto *)local_688);
      }
      google::protobuf::DescriptorPool::ErrorCollector::~ErrorCollector(&local_990);
      google::protobuf::FileDescriptorProto::~FileDescriptorProto(&local_328);
      pRVar9 = (RepeatedPtrField<google::protobuf::FileDescriptorProto> *)
               &(pRVar9->super_RepeatedPtrFieldBase).current_size_;
    } while (pRVar9 != (RepeatedPtrField<google::protobuf::FileDescriptorProto> *)local_980);
  }
  google::protobuf::DescriptorPool::~DescriptorPool(&local_498);
  if (s != (upb_DefPool *)0x0) {
    upb_DefPool_Free(s);
  }
  return;
}

Assistant:

inline void RoundTripDescriptor(const google::protobuf::FileDescriptorSet& set) {
  upb::DefPool defpool;
  google::protobuf::DescriptorPool desc_pool;
  desc_pool.EnforceWeakDependencies(true);
  for (const auto& file : set.file()) {
    google::protobuf::FileDescriptorProto mutable_file(file);
    AddFile(mutable_file, &defpool, &desc_pool);
  }
}